

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::ChArchiveIn::in<chrono::ChColor>
          (ChArchiveIn *this,
          ChNameValue<std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>_> *bVal)

{
  vector<chrono::ChColor,_std::allocator<chrono::ChColor>_> *pvVar1;
  pointer pCVar2;
  ulong uVar3;
  long lVar4;
  ChColor element;
  size_t arraysize;
  ChFunctorArchiveInSpecific<chrono::ChColor> specFuncA;
  char idname [20];
  undefined8 local_8c;
  undefined4 local_84;
  undefined **local_80;
  size_type local_78;
  undefined **local_70;
  undefined8 *local_68;
  char *local_60;
  undefined ***local_58;
  undefined1 local_50;
  char local_48 [24];
  
  pvVar1 = bVal->_value;
  pCVar2 = (pvVar1->super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pvVar1->super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar2) {
    (pvVar1->super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>)._M_impl.
    super__Vector_impl_data._M_finish = pCVar2;
  }
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&local_78);
  std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>::resize(bVal->_value,local_78);
  if (local_78 != 0) {
    local_80 = &PTR__ChFunctorArchiveIn_00b672b0;
    lVar4 = 0;
    uVar3 = 0;
    do {
      sprintf(local_48,"%lu",uVar3);
      local_8c = 0x3f8000003f800000;
      local_84 = 0x3f800000;
      local_70 = local_80;
      local_58 = &local_70;
      local_50 = 0;
      local_68 = &local_8c;
      local_60 = local_48;
      (**(code **)(*(long *)this + 0x60))(this,&local_60);
      pCVar2 = (bVal->_value->super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      if ((undefined8 *)((long)&pCVar2->R + lVar4) != &local_8c) {
        *(undefined4 *)((long)&pCVar2->R + lVar4) = (undefined4)local_8c;
        *(undefined4 *)((long)&pCVar2->G + lVar4) = local_8c._4_4_;
        *(undefined4 *)((long)&pCVar2->B + lVar4) = local_84;
      }
      (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0xc;
    } while (uVar3 < local_78);
  }
  (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::vector<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          bVal.value().resize(arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }